

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3BitvecDestroy(Bitvec *p)

{
  uint local_14;
  uint i;
  Bitvec *p_local;
  
  if (p != (Bitvec *)0x0) {
    if (p->iDivisor != 0) {
      for (local_14 = 0; local_14 < 0x3e; local_14 = local_14 + 1) {
        sqlite3BitvecDestroy(*(Bitvec **)((long)&p->u + (ulong)local_14 * 8));
      }
    }
    sqlite3_free(p);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3BitvecDestroy(Bitvec *p){
  if( p==0 ) return;
  if( p->iDivisor ){
    unsigned int i;
    for(i=0; i<BITVEC_NPTR; i++){
      sqlite3BitvecDestroy(p->u.apSub[i]);
    }
  }
  sqlite3_free(p);
}